

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::buildBlockName
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,String *name)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

String buildBlockName(const String& name)
	{
		return name;
	}